

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void cume_distValueFunc(sqlite3_context *pCtx)

{
  void *pvVar1;
  double r;
  CallCount *p;
  sqlite3_context *pCtx_local;
  
  pvVar1 = sqlite3_aggregate_context(pCtx,0);
  if (pvVar1 != (void *)0x0) {
    sqlite3_result_double
              (pCtx,(double)*(long *)((long)pvVar1 + 8) / (double)*(long *)((long)pvVar1 + 0x10));
  }
  return;
}

Assistant:

static void cume_distValueFunc(sqlite3_context *pCtx){
  struct CallCount *p;
  p = (struct CallCount*)sqlite3_aggregate_context(pCtx, 0);
  if( p ){
    double r = (double)(p->nStep) / (double)(p->nTotal);
    sqlite3_result_double(pCtx, r);
  }
}